

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVSHLMaxInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  DecodeStatus DVar7;
  uint Rd;
  uint size;
  uint Rm;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  size = 3;
  _Rm = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x16,1);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar5 = fieldFromInstruction_4(Address_local._4_4_,5,1);
  uVar6 = fieldFromInstruction_4(Address_local._4_4_,0x12,2);
  DVar7 = DecodeQPRRegisterClass(pMStack_18,uVar3 << 4 | uVar2,(uint64_t)Decoder_local,_Rm);
  _Var1 = Check(&size,DVar7);
  if (_Var1) {
    DVar7 = DecodeDPRRegisterClass(pMStack_18,uVar5 << 4 | uVar4,(uint64_t)Decoder_local,_Rm);
    _Var1 = Check(&size,DVar7);
    if (_Var1) {
      MCOperand_CreateImm0(pMStack_18,(long)(8 << ((byte)uVar6 & 0x1f)));
      Inst_local._4_4_ = size;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeVSHLMaxInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rm, size;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	Rm |= fieldFromInstruction_4(Insn, 5, 1) << 4;
	size = fieldFromInstruction_4(Insn, 18, 2);

	if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, 8 << size);

	return S;
}